

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

QList<int> * __thiscall
QMainWindowLayoutState::indexOf
          (QList<int> *__return_storage_ptr__,QMainWindowLayoutState *this,QWidget *widget)

{
  QWidget *toolBar;
  QDockWidget *pQVar1;
  QDockWidgetGroupWindow *pQVar2;
  parameter_type t;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  (__return_storage_ptr__->d).size = 0;
  toolBar = &QtPrivate::qobject_cast_helper<QToolBar*,QObject>(&widget->super_QObject)->
             super_QWidget;
  if (toolBar == (QWidget *)0x0) {
    pQVar1 = QtPrivate::qobject_cast_helper<QDockWidget*,QObject>(&widget->super_QObject);
    if ((pQVar1 == (QDockWidget *)0x0) &&
       (pQVar2 = QtPrivate::qobject_cast_helper<QDockWidgetGroupWindow*,QObject>
                           (&widget->super_QObject), pQVar2 == (QDockWidgetGroupWindow *)0x0))
    goto LAB_00400200;
    QDockAreaLayout::indexOf((QList<int> *)&local_40,&this->dockAreaLayout,widget);
    QArrayDataPointer<int>::operator=(&__return_storage_ptr__->d,&local_40);
    QArrayDataPointer<int>::~QArrayDataPointer(&local_40);
    if ((__return_storage_ptr__->d).size == 0) goto LAB_00400200;
    t = 1;
  }
  else {
    QToolBarAreaLayout::indexOf((QList<int> *)&local_40,&this->toolBarAreaLayout,toolBar);
    QArrayDataPointer<int>::operator=(&__return_storage_ptr__->d,&local_40);
    QArrayDataPointer<int>::~QArrayDataPointer(&local_40);
    t = 0;
    if ((__return_storage_ptr__->d).size == 0) goto LAB_00400200;
  }
  QList<int>::prepend(__return_storage_ptr__,t);
LAB_00400200:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<int> QMainWindowLayoutState::indexOf(QWidget *widget) const
{
    QList<int> result;

#if QT_CONFIG(toolbar)
    // is it a toolbar?
    if (QToolBar *toolBar = qobject_cast<QToolBar*>(widget)) {
        result = toolBarAreaLayout.indexOf(toolBar);
        if (!result.isEmpty())
            result.prepend(0);
        return result;
    }
#endif

#if QT_CONFIG(dockwidget)
    // is it a dock widget?
    if (qobject_cast<QDockWidget *>(widget) || qobject_cast<QDockWidgetGroupWindow *>(widget)) {
        result = dockAreaLayout.indexOf(widget);
        if (!result.isEmpty())
            result.prepend(1);
        return result;
    }
#endif // QT_CONFIG(dockwidget)

    return result;
}